

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void crunch_backwards(membuf *inbuf,membuf *outbuf,crunch_options *options,crunch_info *info)

{
  int local_4c;
  int local_48;
  int copy_used;
  int safety;
  int outlen;
  search_nodep snp;
  encode_match_data emd;
  crunch_info *info_local;
  crunch_options *options_local;
  membuf *outbuf_local;
  membuf *inbuf_local;
  
  info_local = (crunch_info *)options;
  if (options == (crunch_options *)0x0) {
    info_local = (crunch_info *)default_options;
  }
  emd[0].priv = info;
  copy_used = membuf_memlen(outbuf);
  snp = (search_nodep)0x0;
  optimal_init((_encode_match_data *)&snp);
  match_ctx_init(crunch_backwards::ctx,inbuf,info_local[1].needed_safety_offset,
                 info_local[2].literal_sequences_used,info_local[3].literal_sequences_used);
  snp = (search_nodep)0x0;
  optimal_init((_encode_match_data *)&snp);
  _safety = do_compress(crunch_backwards::ctx,(_encode_match_data *)&snp,(char *)*info_local,
                        info_local[1].literal_sequences_used,info_local[2].needed_safety_offset);
  local_48 = do_output(crunch_backwards::ctx,_safety,(_encode_match_data *)&snp,optimal_encode,
                       outbuf,&local_4c);
  optimal_free((_encode_match_data *)&snp);
  search_node_free(_safety);
  match_ctx_free(crunch_backwards::ctx);
  if (emd[0].priv != (void *)0x0) {
    *(int *)emd[0].priv = local_4c;
    *(int *)((long)emd[0].priv + 4) = local_48;
  }
  return;
}

Assistant:

void crunch_backwards(struct membuf *inbuf,
                      struct membuf *outbuf,
                      struct crunch_options *options, /* IN */
                      struct crunch_info *info) /* OUT */
{
    static match_ctx ctx;
    encode_match_data emd;
    search_nodep snp;
    int outlen;
    int safety;
    int copy_used;

    if(options == NULL)
    {
        options = default_options;
    }

    outlen = membuf_memlen(outbuf);
    emd->out = NULL;
    optimal_init(emd);

    //LOG(LOG_NORMAL, (" Length of indata: %d bytes.\n", membuf_memlen(inbuf)));

    match_ctx_init(ctx, inbuf, options->max_len, options->max_offset,
                   options->use_imprecise_rle);


    emd->out = NULL;
    optimal_init(emd);

    snp = do_compress(ctx, emd, options->exported_encoding,
                      options->max_passes, options->use_literal_sequences);

    safety = do_output(ctx, snp, emd, optimal_encode, outbuf, &copy_used);
    //LOG(LOG_NORMAL, (" Length of crunched data: %d bytes.\n",membuf_memlen(outbuf) - outlen));

    optimal_free(emd);
    search_node_free(snp);
    match_ctx_free(ctx);

    if(info != NULL)
    {
        info->literal_sequences_used = copy_used;
        info->needed_safety_offset = safety;
    }
}